

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cc
# Opt level: O1

int __thiscall Server::close(Server *this,int __fd)

{
  mutex *__mutex;
  shared_ptr<ClientSocket> *psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  iterator __position;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pthread_mutex_t *__mutex_00;
  bool bVar4;
  int iVar5;
  undefined8 uVar6;
  long lVar7;
  __normal_iterator<std::shared_ptr<ClientSocket>_*,_std::vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>_>
  __first;
  __normal_iterator<std::shared_ptr<ClientSocket>_*,_std::vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>_>
  _Var8;
  int local_4c;
  int *local_48;
  pthread_mutex_t *local_40;
  int *local_38;
  
  __mutex = &this->_staleFileDescriptorsMutex;
  local_4c = __fd;
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar5 != 0) {
    uVar6 = std::__throw_system_error(iVar5);
    pthread_mutex_unlock(local_40);
    _Unwind_Resume(uVar6);
  }
  _Var8._M_current =
       (this->_clientSockets).
       super__Vector_base<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->_clientSockets).
           super__Vector_base<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_48 = &local_4c;
  lVar7 = (long)psVar1 - (long)_Var8._M_current >> 6;
  local_40 = (pthread_mutex_t *)__mutex;
  local_38 = local_48;
  if (0 < lVar7) {
    lVar7 = lVar7 + 1;
    do {
      bVar4 = __gnu_cxx::__ops::_Iter_pred<Server::close(int)::$_0>::operator()
                        ((_Iter_pred<Server::close(int)::__0> *)&local_48,_Var8);
      __first._M_current = _Var8._M_current;
      if (bVar4) goto LAB_001081e3;
      bVar4 = __gnu_cxx::__ops::_Iter_pred<Server::close(int)::$_0>::operator()
                        ((_Iter_pred<Server::close(int)::__0> *)&local_48,_Var8._M_current + 1);
      __first._M_current = _Var8._M_current + 1;
      if (bVar4) goto LAB_001081e3;
      bVar4 = __gnu_cxx::__ops::_Iter_pred<Server::close(int)::$_0>::operator()
                        ((_Iter_pred<Server::close(int)::__0> *)&local_48,_Var8._M_current + 2);
      __first._M_current = _Var8._M_current + 2;
      if (bVar4) goto LAB_001081e3;
      bVar4 = __gnu_cxx::__ops::_Iter_pred<Server::close(int)::$_0>::operator()
                        ((_Iter_pred<Server::close(int)::__0> *)&local_48,_Var8._M_current + 3);
      __first._M_current = _Var8._M_current + 3;
      if (bVar4) goto LAB_001081e3;
      _Var8._M_current = _Var8._M_current + 4;
      lVar7 = lVar7 + -1;
    } while (1 < lVar7);
  }
  lVar7 = (long)psVar1 - (long)_Var8._M_current >> 4;
  if (lVar7 != 1) {
    if (lVar7 != 2) {
      __first._M_current = psVar1;
      if ((lVar7 != 3) ||
         (bVar4 = __gnu_cxx::__ops::_Iter_pred<Server::close(int)::$_0>::operator()
                            ((_Iter_pred<Server::close(int)::__0> *)&local_48,_Var8),
         __first._M_current = _Var8._M_current, bVar4)) goto LAB_001081e3;
      _Var8._M_current = _Var8._M_current + 1;
    }
    bVar4 = __gnu_cxx::__ops::_Iter_pred<Server::close(int)::$_0>::operator()
                      ((_Iter_pred<Server::close(int)::__0> *)&local_48,_Var8);
    __first._M_current = _Var8._M_current;
    if (bVar4) goto LAB_001081e3;
    _Var8._M_current = _Var8._M_current + 1;
  }
  bVar4 = __gnu_cxx::__ops::_Iter_pred<Server::close(int)::$_0>::operator()
                    ((_Iter_pred<Server::close(int)::__0> *)&local_48,_Var8);
  __first._M_current = _Var8._M_current;
  if (!bVar4) {
    __first._M_current = psVar1;
  }
LAB_001081e3:
  _Var8._M_current = __first._M_current + 1;
  if (_Var8._M_current != psVar1 && __first._M_current != psVar1) {
    do {
      bVar4 = __gnu_cxx::__ops::_Iter_pred<Server::close(int)::$_0>::operator()
                        ((_Iter_pred<Server::close(int)::__0> *)&local_38,_Var8);
      if (!bVar4) {
        peVar2 = ((_Var8._M_current)->super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        p_Var3 = ((_Var8._M_current)->super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        ((_Var8._M_current)->super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             (element_type *)0x0;
        ((_Var8._M_current)->super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>).
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        this_00 = ((__first._M_current)->
                  super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
        ((__first._M_current)->super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
             = peVar2;
        ((__first._M_current)->super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>).
        _M_refcount._M_pi = p_Var3;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        __first._M_current = __first._M_current + 1;
      }
      _Var8._M_current = _Var8._M_current + 1;
    } while (_Var8._M_current != psVar1);
  }
  std::vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>::
  _M_erase(&this->_clientSockets,(iterator)__first._M_current,
           (this->_clientSockets).
           super__Vector_base<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>
           ._M_impl.super__Vector_impl_data._M_finish);
  __mutex_00 = local_40;
  __position._M_current =
       (this->_staleFileDescriptors).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->_staleFileDescriptors).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->_staleFileDescriptors,__position,&local_4c)
    ;
  }
  else {
    *__position._M_current = local_4c;
    (this->_staleFileDescriptors).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  iVar5 = pthread_mutex_unlock(__mutex_00);
  return iVar5;
}

Assistant:

void Server::close( int fileDescriptor )
{
  std::lock_guard<std::mutex> lock( _staleFileDescriptorsMutex );

  _clientSockets.erase( std::remove_if( _clientSockets.begin(), _clientSockets.end(),
                                        [&] ( std::shared_ptr<ClientSocket> socket )
                                        {
                                          return socket->fileDescriptor() == fileDescriptor;
                                        } ),
                                        _clientSockets.end() );

  _staleFileDescriptors.push_back( fileDescriptor );
}